

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

void __thiscall opengv::math::Bracket::Bracket(Bracket *this,double lowerBound,double upperBound)

{
  this->_vptr_Bracket = (_func_int **)&PTR__Bracket_00408c48;
  this->_lowerBound = lowerBound;
  this->_upperBound = upperBound;
  this->_lowerBoundChangesComputed = false;
  this->_upperBoundChangesComputed = false;
  this->_lowerBoundChanges = 0;
  this->_upperBoundChanges = 0;
  return;
}

Assistant:

opengv::math::Bracket::Bracket( double lowerBound, double upperBound ) :
    _lowerBound(lowerBound),
    _upperBound(upperBound),
    _lowerBoundChangesComputed(false),
    _upperBoundChangesComputed(false),
    _lowerBoundChanges(0),
    _upperBoundChanges(0)
{}